

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O0

StatusOr<bool> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetBool(UnparseProto3Type *this,Field f)

{
  bool bVar1;
  Field *pFVar2;
  ulong uVar3;
  string *psVar4;
  Message *this_00;
  Type *this_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  StatusOr<bool> SVar6;
  AlphaNum local_b8;
  AlphaNum local_88;
  undefined1 local_58 [48];
  Status local_28;
  bool local_1b;
  bool local_1a;
  bool local_19;
  Field local_18;
  Field f_local;
  
  local_18 = f;
  f_local = (Field)this;
  pFVar2 = ResolverPool::Field::proto(f);
  Field::default_value_abi_cxx11_(pFVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pFVar2 = ResolverPool::Field::proto(local_18);
    psVar4 = Field::default_value_abi_cxx11_(pFVar2);
    bVar1 = std::operator==(psVar4,"false");
    if (bVar1) {
      local_1a = false;
      absl::lts_20240722::StatusOr<bool>::StatusOr<bool,_0>((StatusOr<bool> *)this,&local_1a);
      uVar5 = extraout_RDX_00;
    }
    else {
      pFVar2 = ResolverPool::Field::proto(local_18);
      psVar4 = Field::default_value_abi_cxx11_(pFVar2);
      bVar1 = std::operator==(psVar4,"true");
      if (bVar1) {
        local_1b = true;
        absl::lts_20240722::StatusOr<bool>::StatusOr<bool,_0>((StatusOr<bool> *)this,&local_1b);
        uVar5 = extraout_RDX_01;
      }
      else {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_88,"bad default value in type.proto: ");
        this_00 = ResolverPool::Field::parent(local_18);
        this_01 = ResolverPool::Message::proto(this_00);
        psVar4 = Type::name_abi_cxx11_(this_01);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_b8,psVar4);
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_58,&local_88);
        local_58._32_16_ =
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
        absl::lts_20240722::InternalError(&local_28,local_58._32_8_,local_58._40_8_);
        absl::lts_20240722::StatusOr<bool>::StatusOr<absl::lts_20240722::Status,_0>
                  ((StatusOr<bool> *)this,&local_28);
        absl::lts_20240722::Status::~Status(&local_28);
        std::__cxx11::string::~string((string *)local_58);
        uVar5 = extraout_RDX_02;
      }
    }
  }
  else {
    local_19 = false;
    absl::lts_20240722::StatusOr<bool>::StatusOr<bool,_0>((StatusOr<bool> *)this,&local_19);
    uVar5 = extraout_RDX;
  }
  SVar6.super_StatusOrData<bool>._8_8_ = uVar5;
  SVar6.super_StatusOrData<bool>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)this;
  return (StatusOr<bool>)SVar6.super_StatusOrData<bool>;
}

Assistant:

static absl::StatusOr<bool> GetBool(Field f) {
    if (f->proto().default_value().empty()) {
      return false;
    } else if (f->proto().default_value() == "false") {
      return false;
    } else if (f->proto().default_value() == "true") {
      return true;
    } else {
      return absl::InternalError(absl::StrCat(
          "bad default value in type.proto: ", f->parent().proto().name()));
    }
  }